

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spirv_msl.cpp
# Opt level: O0

unordered_set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
* spirv_cross::CompilerMSL::get_illegal_func_names_abi_cxx11_(void)

{
  initializer_list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  __l;
  int iVar1;
  string *local_18f8;
  allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_10d8;
  key_equal local_10d7;
  hasher local_10d6;
  undefined1 local_10d5;
  allocator local_10d4;
  allocator local_10d3;
  allocator local_10d2;
  allocator local_10d1;
  allocator local_10d0;
  allocator local_10cf;
  allocator local_10ce;
  allocator local_10cd;
  allocator local_10cc;
  allocator local_10cb;
  allocator local_10ca;
  allocator local_10c9;
  allocator local_10c8;
  allocator local_10c7;
  allocator local_10c6;
  allocator local_10c5;
  allocator local_10c4;
  allocator local_10c3;
  allocator local_10c2;
  allocator local_10c1;
  allocator local_10c0;
  allocator local_10bf;
  allocator local_10be;
  allocator local_10bd;
  allocator local_10bc;
  allocator local_10bb;
  allocator local_10ba;
  allocator local_10b9;
  allocator local_10b8;
  allocator local_10b7;
  allocator local_10b6;
  allocator local_10b5;
  allocator local_10b4;
  allocator local_10b3;
  allocator local_10b2;
  allocator local_10b1;
  allocator local_10b0;
  allocator local_10af;
  allocator local_10ae;
  allocator local_10ad;
  allocator local_10ac;
  allocator local_10ab;
  allocator local_10aa;
  allocator local_10a9;
  allocator local_10a8;
  allocator local_10a7;
  allocator local_10a6;
  allocator local_10a5;
  allocator local_10a4;
  allocator local_10a3;
  allocator local_10a2;
  allocator local_10a1;
  allocator local_10a0;
  allocator local_109f;
  allocator local_109e;
  allocator local_109d;
  allocator local_109c;
  allocator local_109b;
  allocator local_109a;
  allocator local_1099;
  allocator local_1098;
  allocator local_1097;
  allocator local_1096;
  allocator local_1095;
  allocator local_1094;
  allocator local_1093;
  allocator local_1092;
  allocator local_1091;
  allocator local_1090;
  allocator local_108f;
  allocator local_108e;
  allocator local_108d;
  allocator local_108c;
  allocator local_108b;
  allocator local_108a;
  allocator local_1089;
  allocator local_1088;
  allocator local_1087;
  allocator local_1086;
  allocator local_1085;
  allocator local_1084;
  allocator local_1083;
  allocator local_1082;
  allocator local_1081;
  allocator local_1080;
  allocator local_107f;
  allocator local_107e;
  allocator local_107d;
  allocator local_107c;
  allocator local_107b;
  allocator local_107a;
  allocator local_1079;
  allocator local_1078;
  allocator local_1077;
  allocator local_1076;
  allocator local_1075;
  allocator local_1074;
  allocator local_1073;
  allocator local_1072;
  allocator local_1071;
  allocator local_1070;
  allocator local_106f;
  allocator local_106e;
  allocator local_106d;
  allocator local_106c;
  allocator local_106b;
  allocator local_106a;
  allocator local_1069;
  allocator local_1068;
  allocator local_1067;
  allocator local_1066;
  allocator local_1065;
  allocator local_1064;
  allocator local_1063;
  allocator local_1062;
  allocator local_1061;
  allocator local_1060;
  allocator local_105f;
  allocator local_105e;
  allocator local_105d;
  allocator local_105c;
  allocator local_105b;
  allocator local_105a;
  allocator local_1059;
  allocator local_1058;
  allocator local_1057;
  allocator local_1056;
  allocator local_1055 [20];
  allocator local_1041;
  string *local_1040;
  string local_1038 [32];
  string local_1018 [32];
  string local_ff8 [32];
  string local_fd8 [32];
  string local_fb8 [32];
  string local_f98 [32];
  string local_f78 [32];
  string local_f58 [32];
  string local_f38 [32];
  string local_f18 [32];
  string local_ef8 [32];
  string local_ed8 [32];
  string local_eb8 [32];
  string local_e98 [32];
  string local_e78 [32];
  string local_e58 [32];
  string local_e38 [32];
  string local_e18 [32];
  string local_df8 [32];
  string local_dd8 [32];
  string local_db8 [32];
  string local_d98 [32];
  string local_d78 [32];
  string local_d58 [32];
  string local_d38 [32];
  string local_d18 [32];
  string local_cf8 [32];
  string local_cd8 [32];
  string local_cb8 [32];
  string local_c98 [32];
  string local_c78 [32];
  string local_c58 [32];
  string local_c38 [32];
  string local_c18 [32];
  string local_bf8 [32];
  string local_bd8 [32];
  string local_bb8 [32];
  string local_b98 [32];
  string local_b78 [32];
  string local_b58 [32];
  string local_b38 [32];
  string local_b18 [32];
  string local_af8 [32];
  string local_ad8 [32];
  string local_ab8 [32];
  string local_a98 [32];
  string local_a78 [32];
  string local_a58 [32];
  string local_a38 [32];
  string local_a18 [32];
  string local_9f8 [32];
  string local_9d8 [32];
  string local_9b8 [32];
  string local_998 [32];
  string local_978 [32];
  string local_958 [32];
  string local_938 [32];
  string local_918 [32];
  string local_8f8 [32];
  string local_8d8 [32];
  string local_8b8 [32];
  string local_898 [32];
  string local_878 [32];
  string local_858 [32];
  string local_838 [32];
  string local_818 [32];
  string local_7f8 [32];
  string local_7d8 [32];
  string local_7b8 [32];
  string local_798 [32];
  string local_778 [32];
  string local_758 [32];
  string local_738 [32];
  string local_718 [32];
  string local_6f8 [32];
  string local_6d8 [32];
  string local_6b8 [32];
  string local_698 [32];
  string local_678 [32];
  string local_658 [32];
  string local_638 [32];
  string local_618 [32];
  string local_5f8 [32];
  string local_5d8 [32];
  string local_5b8 [32];
  string local_598 [32];
  string local_578 [32];
  string local_558 [32];
  string local_538 [32];
  string local_518 [32];
  string local_4f8 [32];
  string local_4d8 [32];
  string local_4b8 [32];
  string local_498 [32];
  string local_478 [32];
  string local_458 [32];
  string local_438 [32];
  string local_418 [32];
  string local_3f8 [32];
  string local_3d8 [32];
  string local_3b8 [32];
  string local_398 [32];
  string local_378 [32];
  string local_358 [32];
  string local_338 [32];
  string local_318 [32];
  string local_2f8 [32];
  string local_2d8 [32];
  string local_2b8 [32];
  string local_298 [32];
  string local_278 [32];
  string local_258 [32];
  string local_238 [32];
  string local_218 [32];
  string local_1f8 [32];
  string local_1d8 [32];
  string local_1b8 [32];
  string local_198 [32];
  string local_178 [32];
  string local_158 [32];
  string local_138 [32];
  string local_118 [32];
  string local_f8 [32];
  string local_d8 [32];
  string local_b8 [32];
  string local_98 [32];
  string local_78 [32];
  string local_58 [32];
  string local_38 [32];
  iterator local_18;
  size_type local_10;
  
  if (get_illegal_func_names[abi:cxx11]()::illegal_func_names_abi_cxx11_ == '\0') {
    iVar1 = __cxa_guard_acquire(&get_illegal_func_names[abi:cxx11]()::illegal_func_names_abi_cxx11_)
    ;
    if (iVar1 != 0) {
      local_10d5 = 1;
      local_1040 = local_1038;
      ::std::allocator<char>::allocator();
      ::std::__cxx11::string::string(local_1038,"main",&local_1041);
      local_1040 = local_1018;
      ::std::allocator<char>::allocator();
      ::std::__cxx11::string::string(local_1018,"fragment",local_1055);
      local_1040 = local_ff8;
      ::std::allocator<char>::allocator();
      ::std::__cxx11::string::string(local_ff8,"vertex",&local_1056);
      local_1040 = local_fd8;
      ::std::allocator<char>::allocator();
      ::std::__cxx11::string::string(local_fd8,"kernel",&local_1057);
      local_1040 = local_fb8;
      ::std::allocator<char>::allocator();
      ::std::__cxx11::string::string(local_fb8,"saturate",&local_1058);
      local_1040 = local_f98;
      ::std::allocator<char>::allocator();
      ::std::__cxx11::string::string(local_f98,"assert",&local_1059);
      local_1040 = local_f78;
      ::std::allocator<char>::allocator();
      ::std::__cxx11::string::string(local_f78,"fmin3",&local_105a);
      local_1040 = local_f58;
      ::std::allocator<char>::allocator();
      ::std::__cxx11::string::string(local_f58,"fmax3",&local_105b);
      local_1040 = local_f38;
      ::std::allocator<char>::allocator();
      ::std::__cxx11::string::string(local_f38,"divide",&local_105c);
      local_1040 = local_f18;
      ::std::allocator<char>::allocator();
      ::std::__cxx11::string::string(local_f18,"fmod",&local_105d);
      local_1040 = local_ef8;
      ::std::allocator<char>::allocator();
      ::std::__cxx11::string::string(local_ef8,"median3",&local_105e);
      local_1040 = local_ed8;
      ::std::allocator<char>::allocator();
      ::std::__cxx11::string::string(local_ed8,"VARIABLE_TRACEPOINT",&local_105f);
      local_1040 = local_eb8;
      ::std::allocator<char>::allocator();
      ::std::__cxx11::string::string(local_eb8,"STATIC_DATA_TRACEPOINT",&local_1060);
      local_1040 = local_e98;
      ::std::allocator<char>::allocator();
      ::std::__cxx11::string::string(local_e98,"STATIC_DATA_TRACEPOINT_V",&local_1061);
      local_1040 = local_e78;
      ::std::allocator<char>::allocator();
      ::std::__cxx11::string::string(local_e78,"METAL_ALIGN",&local_1062);
      local_1040 = local_e58;
      ::std::allocator<char>::allocator();
      ::std::__cxx11::string::string(local_e58,"METAL_ASM",&local_1063);
      local_1040 = local_e38;
      ::std::allocator<char>::allocator();
      ::std::__cxx11::string::string(local_e38,"METAL_CONST",&local_1064);
      local_1040 = local_e18;
      ::std::allocator<char>::allocator();
      ::std::__cxx11::string::string(local_e18,"METAL_DEPRECATED",&local_1065);
      local_1040 = local_df8;
      ::std::allocator<char>::allocator();
      ::std::__cxx11::string::string(local_df8,"METAL_ENABLE_IF",&local_1066);
      local_1040 = local_dd8;
      ::std::allocator<char>::allocator();
      ::std::__cxx11::string::string(local_dd8,"METAL_FUNC",&local_1067);
      local_1040 = local_db8;
      ::std::allocator<char>::allocator();
      ::std::__cxx11::string::string(local_db8,"METAL_INTERNAL",&local_1068);
      local_1040 = local_d98;
      ::std::allocator<char>::allocator();
      ::std::__cxx11::string::string(local_d98,"METAL_NON_NULL_RETURN",&local_1069);
      local_1040 = local_d78;
      ::std::allocator<char>::allocator();
      ::std::__cxx11::string::string(local_d78,"METAL_NORETURN",&local_106a);
      local_1040 = local_d58;
      ::std::allocator<char>::allocator();
      ::std::__cxx11::string::string(local_d58,"METAL_NOTHROW",&local_106b);
      local_1040 = local_d38;
      ::std::allocator<char>::allocator();
      ::std::__cxx11::string::string(local_d38,"METAL_PURE",&local_106c);
      local_1040 = local_d18;
      ::std::allocator<char>::allocator();
      ::std::__cxx11::string::string(local_d18,"METAL_UNAVAILABLE",&local_106d);
      local_1040 = local_cf8;
      ::std::allocator<char>::allocator();
      ::std::__cxx11::string::string(local_cf8,"METAL_IMPLICIT",&local_106e);
      local_1040 = local_cd8;
      ::std::allocator<char>::allocator();
      ::std::__cxx11::string::string(local_cd8,"METAL_EXPLICIT",&local_106f);
      local_1040 = local_cb8;
      ::std::allocator<char>::allocator();
      ::std::__cxx11::string::string(local_cb8,"METAL_CONST_ARG",&local_1070);
      local_1040 = local_c98;
      ::std::allocator<char>::allocator();
      ::std::__cxx11::string::string(local_c98,"METAL_ARG_UNIFORM",&local_1071);
      local_1040 = local_c78;
      ::std::allocator<char>::allocator();
      ::std::__cxx11::string::string(local_c78,"METAL_ZERO_ARG",&local_1072);
      local_1040 = local_c58;
      ::std::allocator<char>::allocator();
      ::std::__cxx11::string::string(local_c58,"METAL_VALID_LOD_ARG",&local_1073);
      local_1040 = local_c38;
      ::std::allocator<char>::allocator();
      ::std::__cxx11::string::string(local_c38,"METAL_VALID_LEVEL_ARG",&local_1074);
      local_1040 = local_c18;
      ::std::allocator<char>::allocator();
      ::std::__cxx11::string::string(local_c18,"METAL_VALID_STORE_ORDER",&local_1075);
      local_1040 = local_bf8;
      ::std::allocator<char>::allocator();
      ::std::__cxx11::string::string(local_bf8,"METAL_VALID_LOAD_ORDER",&local_1076);
      local_1040 = local_bd8;
      ::std::allocator<char>::allocator();
      ::std::__cxx11::string::string
                (local_bd8,"METAL_VALID_COMPARE_EXCHANGE_FAILURE_ORDER",&local_1077);
      local_1040 = local_bb8;
      ::std::allocator<char>::allocator();
      ::std::__cxx11::string::string
                (local_bb8,"METAL_COMPATIBLE_COMPARE_EXCHANGE_ORDERS",&local_1078);
      local_1040 = local_b98;
      ::std::allocator<char>::allocator();
      ::std::__cxx11::string::string(local_b98,"METAL_VALID_RENDER_TARGET",&local_1079);
      local_1040 = local_b78;
      ::std::allocator<char>::allocator();
      ::std::__cxx11::string::string(local_b78,"is_function_constant_defined",&local_107a);
      local_1040 = local_b58;
      ::std::allocator<char>::allocator();
      ::std::__cxx11::string::string(local_b58,"CHAR_BIT",&local_107b);
      local_1040 = local_b38;
      ::std::allocator<char>::allocator();
      ::std::__cxx11::string::string(local_b38,"SCHAR_MAX",&local_107c);
      local_1040 = local_b18;
      ::std::allocator<char>::allocator();
      ::std::__cxx11::string::string(local_b18,"SCHAR_MIN",&local_107d);
      local_1040 = local_af8;
      ::std::allocator<char>::allocator();
      ::std::__cxx11::string::string(local_af8,"UCHAR_MAX",&local_107e);
      local_1040 = local_ad8;
      ::std::allocator<char>::allocator();
      ::std::__cxx11::string::string(local_ad8,"CHAR_MAX",&local_107f);
      local_1040 = local_ab8;
      ::std::allocator<char>::allocator();
      ::std::__cxx11::string::string(local_ab8,"CHAR_MIN",&local_1080);
      local_1040 = local_a98;
      ::std::allocator<char>::allocator();
      ::std::__cxx11::string::string(local_a98,"USHRT_MAX",&local_1081);
      local_1040 = local_a78;
      ::std::allocator<char>::allocator();
      ::std::__cxx11::string::string(local_a78,"SHRT_MAX",&local_1082);
      local_1040 = local_a58;
      ::std::allocator<char>::allocator();
      ::std::__cxx11::string::string(local_a58,"SHRT_MIN",&local_1083);
      local_1040 = local_a38;
      ::std::allocator<char>::allocator();
      ::std::__cxx11::string::string(local_a38,"UINT_MAX",&local_1084);
      local_1040 = local_a18;
      ::std::allocator<char>::allocator();
      ::std::__cxx11::string::string(local_a18,"INT_MAX",&local_1085);
      local_1040 = local_9f8;
      ::std::allocator<char>::allocator();
      ::std::__cxx11::string::string(local_9f8,"INT_MIN",&local_1086);
      local_1040 = local_9d8;
      ::std::allocator<char>::allocator();
      ::std::__cxx11::string::string(local_9d8,"FLT_DIG",&local_1087);
      local_1040 = local_9b8;
      ::std::allocator<char>::allocator();
      ::std::__cxx11::string::string(local_9b8,"FLT_MANT_DIG",&local_1088);
      local_1040 = local_998;
      ::std::allocator<char>::allocator();
      ::std::__cxx11::string::string(local_998,"FLT_MAX_10_EXP",&local_1089);
      local_1040 = local_978;
      ::std::allocator<char>::allocator();
      ::std::__cxx11::string::string(local_978,"FLT_MAX_EXP",&local_108a);
      local_1040 = local_958;
      ::std::allocator<char>::allocator();
      ::std::__cxx11::string::string(local_958,"FLT_MIN_10_EXP",&local_108b);
      local_1040 = local_938;
      ::std::allocator<char>::allocator();
      ::std::__cxx11::string::string(local_938,"FLT_MIN_EXP",&local_108c);
      local_1040 = local_918;
      ::std::allocator<char>::allocator();
      ::std::__cxx11::string::string(local_918,"FLT_RADIX",&local_108d);
      local_1040 = local_8f8;
      ::std::allocator<char>::allocator();
      ::std::__cxx11::string::string(local_8f8,"FLT_MAX",&local_108e);
      local_1040 = local_8d8;
      ::std::allocator<char>::allocator();
      ::std::__cxx11::string::string(local_8d8,"FLT_MIN",&local_108f);
      local_1040 = local_8b8;
      ::std::allocator<char>::allocator();
      ::std::__cxx11::string::string(local_8b8,"FLT_EPSILON",&local_1090);
      local_1040 = local_898;
      ::std::allocator<char>::allocator();
      ::std::__cxx11::string::string(local_898,"FP_ILOGB0",&local_1091);
      local_1040 = local_878;
      ::std::allocator<char>::allocator();
      ::std::__cxx11::string::string(local_878,"FP_ILOGBNAN",&local_1092);
      local_1040 = local_858;
      ::std::allocator<char>::allocator();
      ::std::__cxx11::string::string(local_858,"MAXFLOAT",&local_1093);
      local_1040 = local_838;
      ::std::allocator<char>::allocator();
      ::std::__cxx11::string::string(local_838,"HUGE_VALF",&local_1094);
      local_1040 = local_818;
      ::std::allocator<char>::allocator();
      ::std::__cxx11::string::string(local_818,"INFINITY",&local_1095);
      local_1040 = local_7f8;
      ::std::allocator<char>::allocator();
      ::std::__cxx11::string::string(local_7f8,"NAN",&local_1096);
      local_1040 = local_7d8;
      ::std::allocator<char>::allocator();
      ::std::__cxx11::string::string(local_7d8,"M_E_F",&local_1097);
      local_1040 = local_7b8;
      ::std::allocator<char>::allocator();
      ::std::__cxx11::string::string(local_7b8,"M_LOG2E_F",&local_1098);
      local_1040 = local_798;
      ::std::allocator<char>::allocator();
      ::std::__cxx11::string::string(local_798,"M_LOG10E_F",&local_1099);
      local_1040 = local_778;
      ::std::allocator<char>::allocator();
      ::std::__cxx11::string::string(local_778,"M_LN2_F",&local_109a);
      local_1040 = local_758;
      ::std::allocator<char>::allocator();
      ::std::__cxx11::string::string(local_758,"M_LN10_F",&local_109b);
      local_1040 = local_738;
      ::std::allocator<char>::allocator();
      ::std::__cxx11::string::string(local_738,"M_PI_F",&local_109c);
      local_1040 = local_718;
      ::std::allocator<char>::allocator();
      ::std::__cxx11::string::string(local_718,"M_PI_2_F",&local_109d);
      local_1040 = local_6f8;
      ::std::allocator<char>::allocator();
      ::std::__cxx11::string::string(local_6f8,"M_PI_4_F",&local_109e);
      local_1040 = local_6d8;
      ::std::allocator<char>::allocator();
      ::std::__cxx11::string::string(local_6d8,"M_1_PI_F",&local_109f);
      local_1040 = local_6b8;
      ::std::allocator<char>::allocator();
      ::std::__cxx11::string::string(local_6b8,"M_2_PI_F",&local_10a0);
      local_1040 = local_698;
      ::std::allocator<char>::allocator();
      ::std::__cxx11::string::string(local_698,"M_2_SQRTPI_F",&local_10a1);
      local_1040 = local_678;
      ::std::allocator<char>::allocator();
      ::std::__cxx11::string::string(local_678,"M_SQRT2_F",&local_10a2);
      local_1040 = local_658;
      ::std::allocator<char>::allocator();
      ::std::__cxx11::string::string(local_658,"M_SQRT1_2_F",&local_10a3);
      local_1040 = local_638;
      ::std::allocator<char>::allocator();
      ::std::__cxx11::string::string(local_638,"HALF_DIG",&local_10a4);
      local_1040 = local_618;
      ::std::allocator<char>::allocator();
      ::std::__cxx11::string::string(local_618,"HALF_MANT_DIG",&local_10a5);
      local_1040 = local_5f8;
      ::std::allocator<char>::allocator();
      ::std::__cxx11::string::string(local_5f8,"HALF_MAX_10_EXP",&local_10a6);
      local_1040 = local_5d8;
      ::std::allocator<char>::allocator();
      ::std::__cxx11::string::string(local_5d8,"HALF_MAX_EXP",&local_10a7);
      local_1040 = local_5b8;
      ::std::allocator<char>::allocator();
      ::std::__cxx11::string::string(local_5b8,"HALF_MIN_10_EXP",&local_10a8);
      local_1040 = local_598;
      ::std::allocator<char>::allocator();
      ::std::__cxx11::string::string(local_598,"HALF_MIN_EXP",&local_10a9);
      local_1040 = local_578;
      ::std::allocator<char>::allocator();
      ::std::__cxx11::string::string(local_578,"HALF_RADIX",&local_10aa);
      local_1040 = local_558;
      ::std::allocator<char>::allocator();
      ::std::__cxx11::string::string(local_558,"HALF_MAX",&local_10ab);
      local_1040 = local_538;
      ::std::allocator<char>::allocator();
      ::std::__cxx11::string::string(local_538,"HALF_MIN",&local_10ac);
      local_1040 = local_518;
      ::std::allocator<char>::allocator();
      ::std::__cxx11::string::string(local_518,"HALF_EPSILON",&local_10ad);
      local_1040 = local_4f8;
      ::std::allocator<char>::allocator();
      ::std::__cxx11::string::string(local_4f8,"MAXHALF",&local_10ae);
      local_1040 = local_4d8;
      ::std::allocator<char>::allocator();
      ::std::__cxx11::string::string(local_4d8,"HUGE_VALH",&local_10af);
      local_1040 = local_4b8;
      ::std::allocator<char>::allocator();
      ::std::__cxx11::string::string(local_4b8,"M_E_H",&local_10b0);
      local_1040 = local_498;
      ::std::allocator<char>::allocator();
      ::std::__cxx11::string::string(local_498,"M_LOG2E_H",&local_10b1);
      local_1040 = local_478;
      ::std::allocator<char>::allocator();
      ::std::__cxx11::string::string(local_478,"M_LOG10E_H",&local_10b2);
      local_1040 = local_458;
      ::std::allocator<char>::allocator();
      ::std::__cxx11::string::string(local_458,"M_LN2_H",&local_10b3);
      local_1040 = local_438;
      ::std::allocator<char>::allocator();
      ::std::__cxx11::string::string(local_438,"M_LN10_H",&local_10b4);
      local_1040 = local_418;
      ::std::allocator<char>::allocator();
      ::std::__cxx11::string::string(local_418,"M_PI_H",&local_10b5);
      local_1040 = local_3f8;
      ::std::allocator<char>::allocator();
      ::std::__cxx11::string::string(local_3f8,"M_PI_2_H",&local_10b6);
      local_1040 = local_3d8;
      ::std::allocator<char>::allocator();
      ::std::__cxx11::string::string(local_3d8,"M_PI_4_H",&local_10b7);
      local_1040 = local_3b8;
      ::std::allocator<char>::allocator();
      ::std::__cxx11::string::string(local_3b8,"M_1_PI_H",&local_10b8);
      local_1040 = local_398;
      ::std::allocator<char>::allocator();
      ::std::__cxx11::string::string(local_398,"M_2_PI_H",&local_10b9);
      local_1040 = local_378;
      ::std::allocator<char>::allocator();
      ::std::__cxx11::string::string(local_378,"M_2_SQRTPI_H",&local_10ba);
      local_1040 = local_358;
      ::std::allocator<char>::allocator();
      ::std::__cxx11::string::string(local_358,"M_SQRT2_H",&local_10bb);
      local_1040 = local_338;
      ::std::allocator<char>::allocator();
      ::std::__cxx11::string::string(local_338,"M_SQRT1_2_H",&local_10bc);
      local_1040 = local_318;
      ::std::allocator<char>::allocator();
      ::std::__cxx11::string::string(local_318,"DBL_DIG",&local_10bd);
      local_1040 = local_2f8;
      ::std::allocator<char>::allocator();
      ::std::__cxx11::string::string(local_2f8,"DBL_MANT_DIG",&local_10be);
      local_1040 = local_2d8;
      ::std::allocator<char>::allocator();
      ::std::__cxx11::string::string(local_2d8,"DBL_MAX_10_EXP",&local_10bf);
      local_1040 = local_2b8;
      ::std::allocator<char>::allocator();
      ::std::__cxx11::string::string(local_2b8,"DBL_MAX_EXP",&local_10c0);
      local_1040 = local_298;
      ::std::allocator<char>::allocator();
      ::std::__cxx11::string::string(local_298,"DBL_MIN_10_EXP",&local_10c1);
      local_1040 = local_278;
      ::std::allocator<char>::allocator();
      ::std::__cxx11::string::string(local_278,"DBL_MIN_EXP",&local_10c2);
      local_1040 = local_258;
      ::std::allocator<char>::allocator();
      ::std::__cxx11::string::string(local_258,"DBL_RADIX",&local_10c3);
      local_1040 = local_238;
      ::std::allocator<char>::allocator();
      ::std::__cxx11::string::string(local_238,"DBL_MAX",&local_10c4);
      local_1040 = local_218;
      ::std::allocator<char>::allocator();
      ::std::__cxx11::string::string(local_218,"DBL_MIN",&local_10c5);
      local_1040 = local_1f8;
      ::std::allocator<char>::allocator();
      ::std::__cxx11::string::string(local_1f8,"DBL_EPSILON",&local_10c6);
      local_1040 = local_1d8;
      ::std::allocator<char>::allocator();
      ::std::__cxx11::string::string(local_1d8,"HUGE_VAL",&local_10c7);
      local_1040 = local_1b8;
      ::std::allocator<char>::allocator();
      ::std::__cxx11::string::string(local_1b8,"M_E",&local_10c8);
      local_1040 = local_198;
      ::std::allocator<char>::allocator();
      ::std::__cxx11::string::string(local_198,"M_LOG2E",&local_10c9);
      local_1040 = local_178;
      ::std::allocator<char>::allocator();
      ::std::__cxx11::string::string(local_178,"M_LOG10E",&local_10ca);
      local_1040 = local_158;
      ::std::allocator<char>::allocator();
      ::std::__cxx11::string::string(local_158,"M_LN2",&local_10cb);
      local_1040 = local_138;
      ::std::allocator<char>::allocator();
      ::std::__cxx11::string::string(local_138,"M_LN10",&local_10cc);
      local_1040 = local_118;
      ::std::allocator<char>::allocator();
      ::std::__cxx11::string::string(local_118,"M_PI",&local_10cd);
      local_1040 = local_f8;
      ::std::allocator<char>::allocator();
      ::std::__cxx11::string::string(local_f8,"M_PI_2",&local_10ce);
      local_1040 = local_d8;
      ::std::allocator<char>::allocator();
      ::std::__cxx11::string::string(local_d8,"M_PI_4",&local_10cf);
      local_1040 = local_b8;
      ::std::allocator<char>::allocator();
      ::std::__cxx11::string::string(local_b8,"M_1_PI",&local_10d0);
      local_1040 = local_98;
      ::std::allocator<char>::allocator();
      ::std::__cxx11::string::string(local_98,"M_2_PI",&local_10d1);
      local_1040 = local_78;
      ::std::allocator<char>::allocator();
      ::std::__cxx11::string::string(local_78,"M_2_SQRTPI",&local_10d2);
      local_1040 = local_58;
      ::std::allocator<char>::allocator();
      ::std::__cxx11::string::string(local_58,"M_SQRT2",&local_10d3);
      local_1040 = local_38;
      ::std::allocator<char>::allocator();
      ::std::__cxx11::string::string(local_38,"M_SQRT1_2",&local_10d4);
      local_10d5 = 0;
      local_18 = (iterator)local_1038;
      local_10 = 0x81;
      ::std::
      allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
      allocator(&local_10d8);
      __l._M_len = local_10;
      __l._M_array = local_18;
      ::std::
      unordered_set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::unordered_set(&get_illegal_func_names[abi:cxx11]()::illegal_func_names_abi_cxx11_,__l,0,
                      &local_10d6,&local_10d7,&local_10d8);
      ::std::
      allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
      ~allocator(&local_10d8);
      local_18f8 = (string *)&local_18;
      do {
        local_18f8 = local_18f8 + -0x20;
        ::std::__cxx11::string::~string(local_18f8);
      } while (local_18f8 != local_1038);
      ::std::allocator<char>::~allocator((allocator<char> *)&local_10d4);
      ::std::allocator<char>::~allocator((allocator<char> *)&local_10d3);
      ::std::allocator<char>::~allocator((allocator<char> *)&local_10d2);
      ::std::allocator<char>::~allocator((allocator<char> *)&local_10d1);
      ::std::allocator<char>::~allocator((allocator<char> *)&local_10d0);
      ::std::allocator<char>::~allocator((allocator<char> *)&local_10cf);
      ::std::allocator<char>::~allocator((allocator<char> *)&local_10ce);
      ::std::allocator<char>::~allocator((allocator<char> *)&local_10cd);
      ::std::allocator<char>::~allocator((allocator<char> *)&local_10cc);
      ::std::allocator<char>::~allocator((allocator<char> *)&local_10cb);
      ::std::allocator<char>::~allocator((allocator<char> *)&local_10ca);
      ::std::allocator<char>::~allocator((allocator<char> *)&local_10c9);
      ::std::allocator<char>::~allocator((allocator<char> *)&local_10c8);
      ::std::allocator<char>::~allocator((allocator<char> *)&local_10c7);
      ::std::allocator<char>::~allocator((allocator<char> *)&local_10c6);
      ::std::allocator<char>::~allocator((allocator<char> *)&local_10c5);
      ::std::allocator<char>::~allocator((allocator<char> *)&local_10c4);
      ::std::allocator<char>::~allocator((allocator<char> *)&local_10c3);
      ::std::allocator<char>::~allocator((allocator<char> *)&local_10c2);
      ::std::allocator<char>::~allocator((allocator<char> *)&local_10c1);
      ::std::allocator<char>::~allocator((allocator<char> *)&local_10c0);
      ::std::allocator<char>::~allocator((allocator<char> *)&local_10bf);
      ::std::allocator<char>::~allocator((allocator<char> *)&local_10be);
      ::std::allocator<char>::~allocator((allocator<char> *)&local_10bd);
      ::std::allocator<char>::~allocator((allocator<char> *)&local_10bc);
      ::std::allocator<char>::~allocator((allocator<char> *)&local_10bb);
      ::std::allocator<char>::~allocator((allocator<char> *)&local_10ba);
      ::std::allocator<char>::~allocator((allocator<char> *)&local_10b9);
      ::std::allocator<char>::~allocator((allocator<char> *)&local_10b8);
      ::std::allocator<char>::~allocator((allocator<char> *)&local_10b7);
      ::std::allocator<char>::~allocator((allocator<char> *)&local_10b6);
      ::std::allocator<char>::~allocator((allocator<char> *)&local_10b5);
      ::std::allocator<char>::~allocator((allocator<char> *)&local_10b4);
      ::std::allocator<char>::~allocator((allocator<char> *)&local_10b3);
      ::std::allocator<char>::~allocator((allocator<char> *)&local_10b2);
      ::std::allocator<char>::~allocator((allocator<char> *)&local_10b1);
      ::std::allocator<char>::~allocator((allocator<char> *)&local_10b0);
      ::std::allocator<char>::~allocator((allocator<char> *)&local_10af);
      ::std::allocator<char>::~allocator((allocator<char> *)&local_10ae);
      ::std::allocator<char>::~allocator((allocator<char> *)&local_10ad);
      ::std::allocator<char>::~allocator((allocator<char> *)&local_10ac);
      ::std::allocator<char>::~allocator((allocator<char> *)&local_10ab);
      ::std::allocator<char>::~allocator((allocator<char> *)&local_10aa);
      ::std::allocator<char>::~allocator((allocator<char> *)&local_10a9);
      ::std::allocator<char>::~allocator((allocator<char> *)&local_10a8);
      ::std::allocator<char>::~allocator((allocator<char> *)&local_10a7);
      ::std::allocator<char>::~allocator((allocator<char> *)&local_10a6);
      ::std::allocator<char>::~allocator((allocator<char> *)&local_10a5);
      ::std::allocator<char>::~allocator((allocator<char> *)&local_10a4);
      ::std::allocator<char>::~allocator((allocator<char> *)&local_10a3);
      ::std::allocator<char>::~allocator((allocator<char> *)&local_10a2);
      ::std::allocator<char>::~allocator((allocator<char> *)&local_10a1);
      ::std::allocator<char>::~allocator((allocator<char> *)&local_10a0);
      ::std::allocator<char>::~allocator((allocator<char> *)&local_109f);
      ::std::allocator<char>::~allocator((allocator<char> *)&local_109e);
      ::std::allocator<char>::~allocator((allocator<char> *)&local_109d);
      ::std::allocator<char>::~allocator((allocator<char> *)&local_109c);
      ::std::allocator<char>::~allocator((allocator<char> *)&local_109b);
      ::std::allocator<char>::~allocator((allocator<char> *)&local_109a);
      ::std::allocator<char>::~allocator((allocator<char> *)&local_1099);
      ::std::allocator<char>::~allocator((allocator<char> *)&local_1098);
      ::std::allocator<char>::~allocator((allocator<char> *)&local_1097);
      ::std::allocator<char>::~allocator((allocator<char> *)&local_1096);
      ::std::allocator<char>::~allocator((allocator<char> *)&local_1095);
      ::std::allocator<char>::~allocator((allocator<char> *)&local_1094);
      ::std::allocator<char>::~allocator((allocator<char> *)&local_1093);
      ::std::allocator<char>::~allocator((allocator<char> *)&local_1092);
      ::std::allocator<char>::~allocator((allocator<char> *)&local_1091);
      ::std::allocator<char>::~allocator((allocator<char> *)&local_1090);
      ::std::allocator<char>::~allocator((allocator<char> *)&local_108f);
      ::std::allocator<char>::~allocator((allocator<char> *)&local_108e);
      ::std::allocator<char>::~allocator((allocator<char> *)&local_108d);
      ::std::allocator<char>::~allocator((allocator<char> *)&local_108c);
      ::std::allocator<char>::~allocator((allocator<char> *)&local_108b);
      ::std::allocator<char>::~allocator((allocator<char> *)&local_108a);
      ::std::allocator<char>::~allocator((allocator<char> *)&local_1089);
      ::std::allocator<char>::~allocator((allocator<char> *)&local_1088);
      ::std::allocator<char>::~allocator((allocator<char> *)&local_1087);
      ::std::allocator<char>::~allocator((allocator<char> *)&local_1086);
      ::std::allocator<char>::~allocator((allocator<char> *)&local_1085);
      ::std::allocator<char>::~allocator((allocator<char> *)&local_1084);
      ::std::allocator<char>::~allocator((allocator<char> *)&local_1083);
      ::std::allocator<char>::~allocator((allocator<char> *)&local_1082);
      ::std::allocator<char>::~allocator((allocator<char> *)&local_1081);
      ::std::allocator<char>::~allocator((allocator<char> *)&local_1080);
      ::std::allocator<char>::~allocator((allocator<char> *)&local_107f);
      ::std::allocator<char>::~allocator((allocator<char> *)&local_107e);
      ::std::allocator<char>::~allocator((allocator<char> *)&local_107d);
      ::std::allocator<char>::~allocator((allocator<char> *)&local_107c);
      ::std::allocator<char>::~allocator((allocator<char> *)&local_107b);
      ::std::allocator<char>::~allocator((allocator<char> *)&local_107a);
      ::std::allocator<char>::~allocator((allocator<char> *)&local_1079);
      ::std::allocator<char>::~allocator((allocator<char> *)&local_1078);
      ::std::allocator<char>::~allocator((allocator<char> *)&local_1077);
      ::std::allocator<char>::~allocator((allocator<char> *)&local_1076);
      ::std::allocator<char>::~allocator((allocator<char> *)&local_1075);
      ::std::allocator<char>::~allocator((allocator<char> *)&local_1074);
      ::std::allocator<char>::~allocator((allocator<char> *)&local_1073);
      ::std::allocator<char>::~allocator((allocator<char> *)&local_1072);
      ::std::allocator<char>::~allocator((allocator<char> *)&local_1071);
      ::std::allocator<char>::~allocator((allocator<char> *)&local_1070);
      ::std::allocator<char>::~allocator((allocator<char> *)&local_106f);
      ::std::allocator<char>::~allocator((allocator<char> *)&local_106e);
      ::std::allocator<char>::~allocator((allocator<char> *)&local_106d);
      ::std::allocator<char>::~allocator((allocator<char> *)&local_106c);
      ::std::allocator<char>::~allocator((allocator<char> *)&local_106b);
      ::std::allocator<char>::~allocator((allocator<char> *)&local_106a);
      ::std::allocator<char>::~allocator((allocator<char> *)&local_1069);
      ::std::allocator<char>::~allocator((allocator<char> *)&local_1068);
      ::std::allocator<char>::~allocator((allocator<char> *)&local_1067);
      ::std::allocator<char>::~allocator((allocator<char> *)&local_1066);
      ::std::allocator<char>::~allocator((allocator<char> *)&local_1065);
      ::std::allocator<char>::~allocator((allocator<char> *)&local_1064);
      ::std::allocator<char>::~allocator((allocator<char> *)&local_1063);
      ::std::allocator<char>::~allocator((allocator<char> *)&local_1062);
      ::std::allocator<char>::~allocator((allocator<char> *)&local_1061);
      ::std::allocator<char>::~allocator((allocator<char> *)&local_1060);
      ::std::allocator<char>::~allocator((allocator<char> *)&local_105f);
      ::std::allocator<char>::~allocator((allocator<char> *)&local_105e);
      ::std::allocator<char>::~allocator((allocator<char> *)&local_105d);
      ::std::allocator<char>::~allocator((allocator<char> *)&local_105c);
      ::std::allocator<char>::~allocator((allocator<char> *)&local_105b);
      ::std::allocator<char>::~allocator((allocator<char> *)&local_105a);
      ::std::allocator<char>::~allocator((allocator<char> *)&local_1059);
      ::std::allocator<char>::~allocator((allocator<char> *)&local_1058);
      ::std::allocator<char>::~allocator((allocator<char> *)&local_1057);
      ::std::allocator<char>::~allocator((allocator<char> *)&local_1056);
      ::std::allocator<char>::~allocator((allocator<char> *)local_1055);
      ::std::allocator<char>::~allocator((allocator<char> *)&local_1041);
      __cxa_atexit(::std::
                   unordered_set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   ::~unordered_set,
                   &get_illegal_func_names[abi:cxx11]()::illegal_func_names_abi_cxx11_,&__dso_handle
                  );
      __cxa_guard_release(&get_illegal_func_names[abi:cxx11]()::illegal_func_names_abi_cxx11_);
    }
  }
  return &get_illegal_func_names[abi:cxx11]()::illegal_func_names_abi_cxx11_;
}

Assistant:

const std::unordered_set<std::string> &CompilerMSL::get_illegal_func_names()
{
	static const unordered_set<string> illegal_func_names = {
		"main",
		"fragment",
		"vertex",
		"kernel",
		"saturate",
		"assert",
		"fmin3",
		"fmax3",
		"divide",
		"fmod",
		"median3",
		"VARIABLE_TRACEPOINT",
		"STATIC_DATA_TRACEPOINT",
		"STATIC_DATA_TRACEPOINT_V",
		"METAL_ALIGN",
		"METAL_ASM",
		"METAL_CONST",
		"METAL_DEPRECATED",
		"METAL_ENABLE_IF",
		"METAL_FUNC",
		"METAL_INTERNAL",
		"METAL_NON_NULL_RETURN",
		"METAL_NORETURN",
		"METAL_NOTHROW",
		"METAL_PURE",
		"METAL_UNAVAILABLE",
		"METAL_IMPLICIT",
		"METAL_EXPLICIT",
		"METAL_CONST_ARG",
		"METAL_ARG_UNIFORM",
		"METAL_ZERO_ARG",
		"METAL_VALID_LOD_ARG",
		"METAL_VALID_LEVEL_ARG",
		"METAL_VALID_STORE_ORDER",
		"METAL_VALID_LOAD_ORDER",
		"METAL_VALID_COMPARE_EXCHANGE_FAILURE_ORDER",
		"METAL_COMPATIBLE_COMPARE_EXCHANGE_ORDERS",
		"METAL_VALID_RENDER_TARGET",
		"is_function_constant_defined",
		"CHAR_BIT",
		"SCHAR_MAX",
		"SCHAR_MIN",
		"UCHAR_MAX",
		"CHAR_MAX",
		"CHAR_MIN",
		"USHRT_MAX",
		"SHRT_MAX",
		"SHRT_MIN",
		"UINT_MAX",
		"INT_MAX",
		"INT_MIN",
		"FLT_DIG",
		"FLT_MANT_DIG",
		"FLT_MAX_10_EXP",
		"FLT_MAX_EXP",
		"FLT_MIN_10_EXP",
		"FLT_MIN_EXP",
		"FLT_RADIX",
		"FLT_MAX",
		"FLT_MIN",
		"FLT_EPSILON",
		"FP_ILOGB0",
		"FP_ILOGBNAN",
		"MAXFLOAT",
		"HUGE_VALF",
		"INFINITY",
		"NAN",
		"M_E_F",
		"M_LOG2E_F",
		"M_LOG10E_F",
		"M_LN2_F",
		"M_LN10_F",
		"M_PI_F",
		"M_PI_2_F",
		"M_PI_4_F",
		"M_1_PI_F",
		"M_2_PI_F",
		"M_2_SQRTPI_F",
		"M_SQRT2_F",
		"M_SQRT1_2_F",
		"HALF_DIG",
		"HALF_MANT_DIG",
		"HALF_MAX_10_EXP",
		"HALF_MAX_EXP",
		"HALF_MIN_10_EXP",
		"HALF_MIN_EXP",
		"HALF_RADIX",
		"HALF_MAX",
		"HALF_MIN",
		"HALF_EPSILON",
		"MAXHALF",
		"HUGE_VALH",
		"M_E_H",
		"M_LOG2E_H",
		"M_LOG10E_H",
		"M_LN2_H",
		"M_LN10_H",
		"M_PI_H",
		"M_PI_2_H",
		"M_PI_4_H",
		"M_1_PI_H",
		"M_2_PI_H",
		"M_2_SQRTPI_H",
		"M_SQRT2_H",
		"M_SQRT1_2_H",
		"DBL_DIG",
		"DBL_MANT_DIG",
		"DBL_MAX_10_EXP",
		"DBL_MAX_EXP",
		"DBL_MIN_10_EXP",
		"DBL_MIN_EXP",
		"DBL_RADIX",
		"DBL_MAX",
		"DBL_MIN",
		"DBL_EPSILON",
		"HUGE_VAL",
		"M_E",
		"M_LOG2E",
		"M_LOG10E",
		"M_LN2",
		"M_LN10",
		"M_PI",
		"M_PI_2",
		"M_PI_4",
		"M_1_PI",
		"M_2_PI",
		"M_2_SQRTPI",
		"M_SQRT2",
		"M_SQRT1_2",
	};

	return illegal_func_names;
}